

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void CollectColorBlueTransforms_SSE2
               (uint32_t *argb,int stride,int tile_width,int tile_height,int green_to_blue,
               int red_to_blue,int *histo)

{
  uint7 uVar1;
  uint7 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  uint uVar14;
  int in_ECX;
  ulong uVar15;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  short in_R8W;
  short in_R9W;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  long in_stack_00000008;
  int left_over;
  __m128i I;
  __m128i H1;
  __m128i H0;
  __m128i G1;
  __m128i G0;
  __m128i F1;
  __m128i F0;
  __m128i E1;
  __m128i E0;
  __m128i D1;
  __m128i D0;
  __m128i C1;
  __m128i C0;
  __m128i B1;
  __m128i B0;
  __m128i A1;
  __m128i A0;
  __m128i in1;
  __m128i in0;
  uint16_t values [8];
  int x;
  int i;
  uint32_t *src;
  int y;
  __m128i mask_b;
  __m128i mask_g;
  __m128i mults_g;
  __m128i mults_r;
  int in_stack_fffffffffffffb50;
  undefined1 in_stack_fffffffffffffb58 [16];
  int *in_stack_fffffffffffffb70;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_360;
  int local_35c;
  long local_358;
  int local_34c;
  undefined8 local_348;
  undefined8 uStack_340;
  undefined8 local_338;
  undefined8 uStack_330;
  ulong local_328;
  ulong uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined1 (*local_2e8) [16];
  undefined1 (*local_2e0) [16];
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  undefined4 local_238;
  undefined4 local_234;
  uint local_230;
  int local_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  ulong local_1a8;
  ulong uStack_1a0;
  ulong local_198;
  ulong uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_11c;
  ulong local_118;
  ulong uStack_110;
  undefined4 local_fc;
  ulong local_f8;
  ulong uStack_f0;
  undefined4 local_dc;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  ulong local_88;
  ulong uStack_80;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined4 local_58;
  undefined4 local_54;
  undefined4 local_50;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  undefined4 local_2c;
  ulong local_28;
  int *piStack_20;
  ulong local_18;
  ulong uStack_10;
  
  local_22c = (int)(short)(in_R9W << 8) << 0xb;
  local_318 = CONCAT44(local_22c,local_22c);
  uStack_310 = CONCAT44(local_22c,local_22c);
  uVar14 = (uint)(int)(short)(in_R8W << 8) >> 5;
  local_230 = uVar14 & 0xffff;
  local_328 = CONCAT44(uVar14,uVar14) & 0xffff0000ffff;
  uStack_320 = CONCAT44(uVar14,uVar14) & 0xffff0000ffff;
  local_234 = 0xff00;
  local_4c = 0xff00;
  local_50 = 0xff00;
  local_54 = 0xff00;
  local_58 = 0xff00;
  local_338 = 0xff000000ff00;
  uStack_330 = 0xff000000ff00;
  local_238 = 0xff;
  local_2c = 0xff;
  local_30 = 0xff;
  local_34 = 0xff;
  local_38 = 0xff;
  local_348 = 0xff000000ff;
  uStack_340 = 0xff000000ff;
  for (local_34c = 0; local_34c < in_ECX; local_34c = local_34c + 1) {
    local_358 = in_RDI + (long)(local_34c * in_ESI) * 4;
    for (local_360 = 0; local_360 + 8 <= (int)in_EDX; local_360 = local_360 + 8) {
      local_2e0 = (undefined1 (*) [16])(local_358 + (long)local_360 * 4);
      local_1b8 = *(ulong *)*local_2e0;
      uStack_1b0 = *(ulong *)(*local_2e0 + 8);
      local_2e8 = (undefined1 (*) [16])(local_358 + (long)(local_360 + 4) * 4);
      local_1d8 = *(ulong *)*local_2e8;
      uStack_1d0 = *(ulong *)(*local_2e8 + 8);
      local_fc = 8;
      auVar16 = psllw(*local_2e0,ZEXT416(8));
      local_11c = 8;
      auVar17 = psllw(*local_2e8,ZEXT416(8));
      local_178 = local_1b8 & 0xff000000ff00;
      uStack_170 = uStack_1b0 & 0xff000000ff00;
      local_198 = local_1d8 & 0xff000000ff00;
      uStack_190 = uStack_1d0 & 0xff000000ff00;
      local_3a8 = auVar16._0_8_;
      uStack_3a0 = auVar16._8_8_;
      local_138 = local_3a8;
      uStack_130 = uStack_3a0;
      auVar18._8_8_ = uStack_310;
      auVar18._0_8_ = local_318;
      auVar18 = pmulhw(auVar16,auVar18);
      local_3b8 = auVar17._0_8_;
      uStack_3b0 = auVar17._8_8_;
      local_158 = local_3b8;
      uStack_150 = uStack_3b0;
      auVar19._8_8_ = uStack_310;
      auVar19._0_8_ = local_318;
      auVar19 = pmulhw(auVar17,auVar19);
      auVar3._8_8_ = uStack_170;
      auVar3._0_8_ = local_178;
      auVar20._8_8_ = uStack_320;
      auVar20._0_8_ = local_328;
      auVar20 = pmulhw(auVar3,auVar20);
      auVar17._8_8_ = uStack_190;
      auVar17._0_8_ = local_198;
      auVar16._8_8_ = uStack_320;
      auVar16._0_8_ = local_328;
      auVar16 = pmulhw(auVar17,auVar16);
      local_408 = auVar20._0_8_;
      uStack_400 = auVar20._8_8_;
      local_278 = local_408;
      uVar8 = local_278;
      uStack_270 = uStack_400;
      uVar9 = uStack_270;
      local_268._0_1_ = (char)local_1b8;
      local_268._1_1_ = (char)(local_1b8 >> 8);
      local_268._2_1_ = (char)(local_1b8 >> 0x10);
      local_268._3_1_ = (char)(local_1b8 >> 0x18);
      local_268._4_1_ = (char)(local_1b8 >> 0x20);
      local_268._5_1_ = (char)(local_1b8 >> 0x28);
      local_268._6_1_ = (char)(local_1b8 >> 0x30);
      local_268._7_1_ = (char)(local_1b8 >> 0x38);
      uStack_260._0_1_ = (char)uStack_1b0;
      uStack_260._1_1_ = (char)(uStack_1b0 >> 8);
      uStack_260._2_1_ = (char)(uStack_1b0 >> 0x10);
      uStack_260._3_1_ = (char)(uStack_1b0 >> 0x18);
      uStack_260._4_1_ = (char)(uStack_1b0 >> 0x20);
      uStack_260._5_1_ = (char)(uStack_1b0 >> 0x28);
      uStack_260._6_1_ = (char)(uStack_1b0 >> 0x30);
      uStack_260._7_1_ = (char)(uStack_1b0 >> 0x38);
      local_278._0_1_ = auVar20[0];
      local_278._1_1_ = auVar20[1];
      local_278._2_1_ = auVar20[2];
      local_278._3_1_ = auVar20[3];
      local_278._4_1_ = auVar20[4];
      local_278._5_1_ = auVar20[5];
      local_278._6_1_ = auVar20[6];
      local_278._7_1_ = auVar20[7];
      uStack_270._0_1_ = auVar20[8];
      uStack_270._1_1_ = auVar20[9];
      uStack_270._2_1_ = auVar20[10];
      uStack_270._3_1_ = auVar20[0xb];
      uStack_270._4_1_ = auVar20[0xc];
      uStack_270._5_1_ = auVar20[0xd];
      uStack_270._6_1_ = auVar20[0xe];
      uStack_270._7_1_ = auVar20[0xf];
      local_418 = auVar16._0_8_;
      uStack_410 = auVar16._8_8_;
      local_298 = local_418;
      uVar6 = local_298;
      uStack_290 = uStack_410;
      uVar7 = uStack_290;
      local_288._0_1_ = (char)local_1d8;
      local_288._1_1_ = (char)(local_1d8 >> 8);
      local_288._2_1_ = (char)(local_1d8 >> 0x10);
      local_288._3_1_ = (char)(local_1d8 >> 0x18);
      local_288._4_1_ = (char)(local_1d8 >> 0x20);
      local_288._5_1_ = (char)(local_1d8 >> 0x28);
      local_288._6_1_ = (char)(local_1d8 >> 0x30);
      local_288._7_1_ = (char)(local_1d8 >> 0x38);
      uStack_280._0_1_ = (char)uStack_1d0;
      uStack_280._1_1_ = (char)(uStack_1d0 >> 8);
      uStack_280._2_1_ = (char)(uStack_1d0 >> 0x10);
      uStack_280._3_1_ = (char)(uStack_1d0 >> 0x18);
      uStack_280._4_1_ = (char)(uStack_1d0 >> 0x20);
      uStack_280._5_1_ = (char)(uStack_1d0 >> 0x28);
      uStack_280._6_1_ = (char)(uStack_1d0 >> 0x30);
      uStack_280._7_1_ = (char)(uStack_1d0 >> 0x38);
      local_298._0_1_ = auVar16[0];
      local_298._1_1_ = auVar16[1];
      local_298._2_1_ = auVar16[2];
      local_298._3_1_ = auVar16[3];
      local_298._4_1_ = auVar16[4];
      local_298._5_1_ = auVar16[5];
      local_298._6_1_ = auVar16[6];
      local_298._7_1_ = auVar16[7];
      uStack_290._0_1_ = auVar16[8];
      uStack_290._1_1_ = auVar16[9];
      uStack_290._2_1_ = auVar16[10];
      uStack_290._3_1_ = auVar16[0xb];
      uStack_290._4_1_ = auVar16[0xc];
      uStack_290._5_1_ = auVar16[0xd];
      uStack_290._6_1_ = auVar16[0xe];
      uStack_290._7_1_ = auVar16[0xf];
      local_3e8 = auVar18._0_8_;
      uStack_3e0 = auVar18._8_8_;
      local_b8 = local_3e8;
      uVar12 = local_b8;
      uStack_b0 = uStack_3e0;
      uVar13 = uStack_b0;
      local_bc = 0x10;
      local_b8._0_4_ = auVar18._0_4_;
      local_b8._4_4_ = auVar18._4_4_;
      uStack_b0._0_4_ = auVar18._8_4_;
      uStack_b0._4_4_ = auVar18._12_4_;
      local_3f8 = auVar19._0_8_;
      uStack_3f0 = auVar19._8_8_;
      local_d8 = local_3f8;
      uVar10 = local_d8;
      uStack_d0 = uStack_3f0;
      uVar11 = uStack_d0;
      local_dc = 0x10;
      local_d8._0_4_ = auVar19._0_4_;
      local_d8._4_4_ = auVar19._4_4_;
      uStack_d0._0_4_ = auVar19._8_4_;
      uStack_d0._4_4_ = auVar19._12_4_;
      local_2a8 = CONCAT17(local_268._7_1_ - local_278._7_1_,
                           CONCAT16(local_268._6_1_ - local_278._6_1_,
                                    CONCAT15(local_268._5_1_ - local_278._5_1_,
                                             CONCAT14(local_268._4_1_ - local_278._4_1_,
                                                      CONCAT13(local_268._3_1_ - local_278._3_1_,
                                                               CONCAT12(local_268._2_1_ -
                                                                        local_278._2_1_,
                                                                        CONCAT11(local_268._1_1_ -
                                                                                 local_278._1_1_,
                                                                                 (char)local_268 -
                                                                                 (char)local_278))))
                                            )));
      uStack_2a0 = CONCAT17(uStack_260._7_1_ - uStack_270._7_1_,
                            CONCAT16(uStack_260._6_1_ - uStack_270._6_1_,
                                     CONCAT15(uStack_260._5_1_ - uStack_270._5_1_,
                                              CONCAT14(uStack_260._4_1_ - uStack_270._4_1_,
                                                       CONCAT13(uStack_260._3_1_ - uStack_270._3_1_,
                                                                CONCAT12(uStack_260._2_1_ -
                                                                         uStack_270._2_1_,
                                                                         CONCAT11(uStack_260._1_1_ -
                                                                                  uStack_270._1_1_,
                                                                                  (char)uStack_260 -
                                                                                  (char)uStack_270))
                                                               )))));
      local_2b8._0_1_ = auVar18[2];
      local_2b8._1_1_ = auVar18[3];
      local_2b8._4_1_ = auVar18[6];
      local_2b8._5_1_ = auVar18[7];
      uStack_2b0._0_1_ = auVar18[10];
      uStack_2b0._1_1_ = auVar18[0xb];
      uStack_2b0._4_1_ = auVar18[0xe];
      uStack_2b0._5_1_ = auVar18[0xf];
      local_2c8 = CONCAT17(local_288._7_1_ - local_298._7_1_,
                           CONCAT16(local_288._6_1_ - local_298._6_1_,
                                    CONCAT15(local_288._5_1_ - local_298._5_1_,
                                             CONCAT14(local_288._4_1_ - local_298._4_1_,
                                                      CONCAT13(local_288._3_1_ - local_298._3_1_,
                                                               CONCAT12(local_288._2_1_ -
                                                                        local_298._2_1_,
                                                                        CONCAT11(local_288._1_1_ -
                                                                                 local_298._1_1_,
                                                                                 (char)local_288 -
                                                                                 (char)local_298))))
                                            )));
      uStack_2c0 = CONCAT17(uStack_280._7_1_ - uStack_290._7_1_,
                            CONCAT16(uStack_280._6_1_ - uStack_290._6_1_,
                                     CONCAT15(uStack_280._5_1_ - uStack_290._5_1_,
                                              CONCAT14(uStack_280._4_1_ - uStack_290._4_1_,
                                                       CONCAT13(uStack_280._3_1_ - uStack_290._3_1_,
                                                                CONCAT12(uStack_280._2_1_ -
                                                                         uStack_290._2_1_,
                                                                         CONCAT11(uStack_280._1_1_ -
                                                                                  uStack_290._1_1_,
                                                                                  (char)uStack_280 -
                                                                                  (char)uStack_290))
                                                               )))));
      local_2d8._0_1_ = auVar19[2];
      local_2d8._1_1_ = auVar19[3];
      local_2d8._4_1_ = auVar19[6];
      local_2d8._5_1_ = auVar19[7];
      uStack_2d0._0_1_ = auVar19[10];
      uStack_2d0._1_1_ = auVar19[0xb];
      uStack_2d0._4_1_ = auVar19[0xe];
      uStack_2d0._5_1_ = auVar19[0xf];
      uVar1 = CONCAT16(local_268._6_1_ - local_278._6_1_,
                       CONCAT15((local_268._5_1_ - local_278._5_1_) - local_2b8._5_1_,
                                CONCAT14((local_268._4_1_ - local_278._4_1_) - local_2b8._4_1_,
                                         CONCAT13(local_268._3_1_ - local_278._3_1_,
                                                  CONCAT12(local_268._2_1_ - local_278._2_1_,
                                                           CONCAT11((local_268._1_1_ -
                                                                    local_278._1_1_) -
                                                                    local_2b8._1_1_,
                                                                    ((char)local_268 -
                                                                    (char)local_278) -
                                                                    (char)local_2b8))))));
      local_1f8 = CONCAT17(local_268._7_1_ - local_278._7_1_,uVar1);
      uVar2 = CONCAT16(uStack_260._6_1_ - uStack_270._6_1_,
                       CONCAT15((uStack_260._5_1_ - uStack_270._5_1_) - uStack_2b0._5_1_,
                                CONCAT14((uStack_260._4_1_ - uStack_270._4_1_) - uStack_2b0._4_1_,
                                         CONCAT13(uStack_260._3_1_ - uStack_270._3_1_,
                                                  CONCAT12(uStack_260._2_1_ - uStack_270._2_1_,
                                                           CONCAT11((uStack_260._1_1_ -
                                                                    uStack_270._1_1_) -
                                                                    uStack_2b0._1_1_,
                                                                    ((char)uStack_260 -
                                                                    (char)uStack_270) -
                                                                    (char)uStack_2b0))))));
      uStack_1f0 = CONCAT17(uStack_260._7_1_ - uStack_270._7_1_,uVar2);
      local_18 = (ulong)uVar1 & 0xff000000ff;
      uStack_10 = (ulong)uVar2 & 0xff000000ff;
      uVar1 = CONCAT16(local_288._6_1_ - local_298._6_1_,
                       CONCAT15((local_288._5_1_ - local_298._5_1_) - local_2d8._5_1_,
                                CONCAT14((local_288._4_1_ - local_298._4_1_) - local_2d8._4_1_,
                                         CONCAT13(local_288._3_1_ - local_298._3_1_,
                                                  CONCAT12(local_288._2_1_ - local_298._2_1_,
                                                           CONCAT11((local_288._1_1_ -
                                                                    local_298._1_1_) -
                                                                    local_2d8._1_1_,
                                                                    ((char)local_288 -
                                                                    (char)local_298) -
                                                                    (char)local_2d8))))));
      local_218 = CONCAT17(local_288._7_1_ - local_298._7_1_,uVar1);
      uVar2 = CONCAT16(uStack_280._6_1_ - uStack_290._6_1_,
                       CONCAT15((uStack_280._5_1_ - uStack_290._5_1_) - uStack_2d0._5_1_,
                                CONCAT14((uStack_280._4_1_ - uStack_290._4_1_) - uStack_2d0._4_1_,
                                         CONCAT13(uStack_280._3_1_ - uStack_290._3_1_,
                                                  CONCAT12(uStack_280._2_1_ - uStack_290._2_1_,
                                                           CONCAT11((uStack_280._1_1_ -
                                                                    uStack_290._1_1_) -
                                                                    uStack_2d0._1_1_,
                                                                    ((char)uStack_280 -
                                                                    (char)uStack_290) -
                                                                    (char)uStack_2d0))))));
      uStack_210 = CONCAT17(uStack_280._7_1_ - uStack_290._7_1_,uVar2);
      local_28 = (ulong)uVar1 & 0xff000000ff;
      in_stack_fffffffffffffb70 = (int *)((ulong)uVar2 & 0xff000000ff);
      auVar5._8_8_ = uStack_10;
      auVar5._0_8_ = local_18;
      auVar4._8_8_ = in_stack_fffffffffffffb70;
      auVar4._0_8_ = local_28;
      in_stack_fffffffffffffb58 = packssdw(auVar5,auVar4);
      local_240 = &local_378;
      local_258 = in_stack_fffffffffffffb58._0_8_;
      uStack_250 = in_stack_fffffffffffffb58._8_8_;
      local_378 = local_258;
      uStack_370 = uStack_250;
      for (local_35c = 0; local_35c < 8; local_35c = local_35c + 1) {
        uVar15 = (ulong)*(ushort *)((long)&local_378 + (long)local_35c * 2);
        *(int *)(in_stack_00000008 + uVar15 * 4) = *(int *)(in_stack_00000008 + uVar15 * 4) + 1;
      }
      local_2d8 = CONCAT44(local_d8._4_4_ >> 0x10,(uint)local_d8 >> 0x10);
      uStack_2d0 = CONCAT44(uStack_d0._4_4_ >> 0x10,(uint)uStack_d0 >> 0x10);
      local_2b8 = CONCAT44(local_b8._4_4_ >> 0x10,(uint)local_b8 >> 0x10);
      uStack_2b0 = CONCAT44(uStack_b0._4_4_ >> 0x10,(uint)uStack_b0 >> 0x10);
      local_298 = uVar6;
      uStack_290 = uVar7;
      local_288 = local_1d8;
      uStack_280 = uStack_1d0;
      local_278 = uVar8;
      uStack_270 = uVar9;
      local_268 = local_1b8;
      uStack_260 = uStack_1b0;
      local_228 = local_348;
      uStack_220 = uStack_340;
      local_208 = local_348;
      uStack_200 = uStack_340;
      local_1e8 = local_338;
      uStack_1e0 = uStack_330;
      local_1c8 = local_338;
      uStack_1c0 = uStack_330;
      local_1a8 = local_328;
      uStack_1a0 = uStack_320;
      local_188 = local_328;
      uStack_180 = uStack_320;
      local_168 = local_318;
      uStack_160 = uStack_310;
      local_148 = local_318;
      uStack_140 = uStack_310;
      local_118 = local_1d8;
      uStack_110 = uStack_1d0;
      local_f8 = local_1b8;
      uStack_f0 = uStack_1b0;
      local_d8 = uVar10;
      uStack_d0 = uVar11;
      local_b8 = uVar12;
      uStack_b0 = uVar13;
      piStack_20 = in_stack_fffffffffffffb70;
    }
  }
  if ((in_EDX & 7) != 0) {
    local_a8 = local_318;
    uStack_a0 = uStack_310;
    local_98 = local_22c;
    local_94 = local_22c;
    local_90 = local_22c;
    local_8c = local_22c;
    local_88 = local_328;
    uStack_80 = uStack_320;
    local_78 = local_230;
    local_74 = local_230;
    local_70 = local_230;
    local_6c = local_230;
    local_68 = local_338;
    uStack_60 = uStack_330;
    local_48 = local_348;
    uStack_40 = uStack_340;
    VP8LCollectColorBlueTransforms_C
              (in_stack_fffffffffffffb58._8_8_,in_stack_fffffffffffffb58._4_4_,
               in_stack_fffffffffffffb58._0_4_,in_EDX & 7,in_stack_fffffffffffffb50,
               (int)((ulong)in_stack_00000008 >> 0x20),in_stack_fffffffffffffb70);
  }
  return;
}

Assistant:

static void CollectColorBlueTransforms_SSE2(const uint32_t* argb, int stride,
                                            int tile_width, int tile_height,
                                            int green_to_blue, int red_to_blue,
                                            int histo[]) {
  const __m128i mults_r = MK_CST_16(CST_5b(red_to_blue), 0);
  const __m128i mults_g = MK_CST_16(0, CST_5b(green_to_blue));
  const __m128i mask_g = _mm_set1_epi32(0x00ff00);  // green mask
  const __m128i mask_b = _mm_set1_epi32(0x0000ff);  // blue mask
  int y;
  for (y = 0; y < tile_height; ++y) {
    const uint32_t* const src = argb + y * stride;
    int i, x;
    for (x = 0; x + SPAN <= tile_width; x += SPAN) {
      uint16_t values[SPAN];
      const __m128i in0 = _mm_loadu_si128((__m128i*)&src[x +        0]);
      const __m128i in1 = _mm_loadu_si128((__m128i*)&src[x + SPAN / 2]);
      const __m128i A0 = _mm_slli_epi16(in0, 8);        // r 0  | b 0
      const __m128i A1 = _mm_slli_epi16(in1, 8);
      const __m128i B0 = _mm_and_si128(in0, mask_g);    // 0 0  | g 0
      const __m128i B1 = _mm_and_si128(in1, mask_g);
      const __m128i C0 = _mm_mulhi_epi16(A0, mults_r);  // x db | 0 0
      const __m128i C1 = _mm_mulhi_epi16(A1, mults_r);
      const __m128i D0 = _mm_mulhi_epi16(B0, mults_g);  // 0 0  | x db
      const __m128i D1 = _mm_mulhi_epi16(B1, mults_g);
      const __m128i E0 = _mm_sub_epi8(in0, D0);         // x x  | x b'
      const __m128i E1 = _mm_sub_epi8(in1, D1);
      const __m128i F0 = _mm_srli_epi32(C0, 16);        // 0 0  | x db
      const __m128i F1 = _mm_srli_epi32(C1, 16);
      const __m128i G0 = _mm_sub_epi8(E0, F0);          // 0 0  | x b'
      const __m128i G1 = _mm_sub_epi8(E1, F1);
      const __m128i H0 = _mm_and_si128(G0, mask_b);     // 0 0  | 0 b
      const __m128i H1 = _mm_and_si128(G1, mask_b);
      const __m128i I = _mm_packs_epi32(H0, H1);        // 0 b' | 0 b'
      _mm_storeu_si128((__m128i*)values, I);
      for (i = 0; i < SPAN; ++i) ++histo[values[i]];
    }
  }
  {
    const int left_over = tile_width & (SPAN - 1);
    if (left_over > 0) {
      VP8LCollectColorBlueTransforms_C(argb + tile_width - left_over, stride,
                                       left_over, tile_height,
                                       green_to_blue, red_to_blue, histo);
    }
  }
}